

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.cpp
# Opt level: O0

void __thiscall Assimp::ObjExporter::~ObjExporter(ObjExporter *this)

{
  ObjExporter *this_local;
  
  std::__cxx11::string::~string((string *)&this->endl);
  std::vector<Assimp::ObjExporter::MeshInstance,_std::allocator<Assimp::ObjExporter::MeshInstance>_>
  ::~vector(&this->mMeshes);
  indexMap<Assimp::ObjExporter::vertexData,_Assimp::ObjExporter::vertexDataCompare>::~indexMap
            (&this->mVpMap);
  indexMap<aiVector3t<float>,_Assimp::ObjExporter::aiVectorCompare>::~indexMap(&this->mVtMap);
  indexMap<aiVector3t<float>,_Assimp::ObjExporter::aiVectorCompare>::~indexMap(&this->mVnMap);
  std::vector<Assimp::ObjExporter::vertexData,_std::allocator<Assimp::ObjExporter::vertexData>_>::
  ~vector(&this->vp);
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::~vector(&this->vc);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector(&this->vt);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector(&this->vn);
  std::__cxx11::string::~string((string *)&this->filename);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->mOutputMat);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
  return;
}

Assistant:

ObjExporter::~ObjExporter() {
    // empty
}